

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1352d2::SwiftGetVersionCommand::execute
          (SwiftGetVersionCommand *this,BuildSystem *param_1,TaskInterface ti,
          QueueJobContext *context,ResultFn *resultFn)

{
  raw_ostream *prVar1;
  FILE *__stream;
  size_t sVar2;
  hash_code hVar3;
  size_t sVar4;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  char *pcVar5;
  StringRef S;
  StringRef string;
  ArrayRef<llbuild::basic::FileInfo> outputInfos;
  raw_svector_ostream commandOS;
  undefined1 local_2198 [80];
  SmallString<256U> command;
  SmallString<4096U> result;
  char buf [4096];
  
  command.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &command.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>;
  sVar4 = 0x10000000000;
  command.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  command.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  llvm::raw_svector_ostream::raw_svector_ostream(&commandOS,(SmallVectorImpl<char> *)&command);
  string.Length = sVar4;
  string.Data = (char *)(this->executable)._M_string_length;
  llbuild::basic::shellEscaped_abi_cxx11_
            ((string *)&result,(basic *)(this->executable)._M_dataplus._M_p,string);
  llvm::raw_ostream::operator<<((raw_ostream *)&commandOS,(string *)&result);
  std::__cxx11::string::_M_dispose();
  prVar1 = llvm::raw_ostream::operator<<((raw_ostream *)&commandOS," ");
  llvm::raw_ostream::operator<<(prVar1,"--version");
  prVar1 = llvm::raw_ostream::operator<<((raw_ostream *)&commandOS," ");
  llvm::raw_ostream::operator<<(prVar1,"2>/dev/null");
  buf._0_8_ = ((commandOS.OS)->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  buf._8_8_ = ZEXT48(((commandOS.OS)->super_SmallVectorTemplateBase<char,_true>).
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size);
  llvm::StringRef::str_abi_cxx11_((string *)&result,(StringRef *)buf);
  __stream = llbuild::basic::sys::popen
                       ((char *)result.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                                super_SmallVectorTemplateBase<char,_true>.
                                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                BeginX,"r");
  std::__cxx11::string::_M_dispose();
  result.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &result.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>;
  result.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  result.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x1000;
  if (__stream == (FILE *)0x0) {
    pcVar5 = (char *)0x0;
    sVar4 = extraout_RDX;
  }
  else {
    while( true ) {
      sVar2 = fread(buf,1,0x1000,__stream);
      if (sVar2 == 0) break;
      llvm::SmallVectorImpl<char>::append<char_const*,void>
                ((SmallVectorImpl<char> *)&result,buf,buf + sVar2);
    }
    llbuild::basic::sys::pclose(__stream);
    pcVar5 = (char *)(result.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                      super_SmallVectorTemplateBase<char,_true>.
                      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                     0xffffffff);
    sVar4 = extraout_RDX_00;
  }
  local_2198._64_8_ = 0;
  local_2198._72_8_ = 0;
  local_2198._48_8_ = 0;
  local_2198._56_8_ = 0;
  local_2198._32_8_ = 0;
  local_2198._40_8_ = 0;
  local_2198._16_8_ = 0;
  local_2198._24_8_ = 0;
  local_2198._0_4_ = Invalid;
  local_2198._4_4_ = 0;
  local_2198._8_8_ = 0;
  S.Length = sVar4;
  S.Data = pcVar5;
  hVar3 = llvm::hash_value((llvm *)result.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>
                                   .super_SmallVectorTemplateBase<char,_true>.
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX,S);
  outputInfos.Length = hVar3.value;
  outputInfos.Data = (FileInfo *)0x1;
  llbuild::buildsystem::BuildValue::makeSuccessfulCommandWithOutputSignature
            ((BuildValue *)buf,(BuildValue *)local_2198,outputInfos,(CommandSignature)context);
  std::function<void_(llbuild::buildsystem::BuildValue_&&)>::operator()(resultFn,(BuildValue *)buf);
  llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)buf);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&result);
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&commandOS);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&command);
  return;
}

Assistant:

virtual void execute(BuildSystem&,
                       TaskInterface ti,
                       QueueJobContext* context,
                       ResultFn resultFn) override {
    // Construct the command line used to query the swift compiler version.
    //
    // FIXME: Need a decent subprocess interface.
    SmallString<256> command;
    llvm::raw_svector_ostream commandOS(command);
    commandOS << basic::shellEscaped(executable);
    commandOS << " " << "--version";
#if defined(_WIN32)
    // FIXME:  cmd.exe uses different syntax for I/O redirection to null.
    commandOS << " 2>NUL";
#else
    commandOS << " " << "2>/dev/null";
#endif

    // Read the result.
    FILE *fp = basic::sys::popen(commandOS.str().str().c_str(), "r");
    SmallString<4096> result;
    if (fp) {
      char buf[4096];
      for (;;) {
        ssize_t numRead = fread(buf, 1, sizeof(buf), fp);
        if (numRead == 0) {
          // FIXME: Error handling.
          break;
        }
        result.append(StringRef(buf, numRead));
      }
      basic::sys::pclose(fp);
    }

    // For now, we can get away with just encoding this as a successful
    // command and relying on the signature to detect changes.
    //
    // FIXME: We should support BuildValues with arbitrary payloads.
    resultFn(BuildValue::makeSuccessfulCommandWithOutputSignature(
       basic::FileInfo{}, CommandSignature(result)));
  }